

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hh
# Opt level: O1

string * __thiscall
kratos::string::
join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
          (string *__return_storage_ptr__,string *this,
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          begin,__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                end,string *sep)

{
  undefined8 uVar1;
  long lVar2;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  it;
  stringstream local_1c0 [8];
  stringstream stream;
  
  stream._384_8_ = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1c0);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this != begin._M_current)
  {
    lVar2 = 0;
    do {
      if (lVar2 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&stream.field_0x8,((end._M_current)->_M_dataplus)._M_p,
                   (end._M_current)->_M_string_length);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&stream.field_0x8,
                 (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this)->
                 _M_dataplus)._M_p,
                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this)->
                 _M_string_length);
      this = (string *)((long)this + 0x20);
      lVar2 = lVar2 + -0x20;
    } while ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this !=
             begin._M_current);
  }
  uVar1 = stream._384_8_;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1c0);
  std::ios_base::~ios_base((ios_base *)&stream.field_0x78);
  return (string *)uVar1;
}

Assistant:

std::string static join(Iter begin, Iter end, const std::string &sep) {
    std::stringstream stream;
    for (auto it = begin; it != end; it++) {
        if (it != begin) stream << sep;
        stream << *it;
    }
    return stream.str();
}